

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O2

void av1_lowbd_fwd_txfm2d_64x16_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  __m128i *out;
  __m128i *palVar2;
  long lVar3;
  int i;
  long lVar4;
  int32_t *out_00;
  __m128i buf0 [64];
  __m128i buf1 [128];
  
  piVar1 = av1_fwd_txfm_shift_ls[0x12];
  palVar2 = buf1;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    load_buffer_16bit_to_16bit(input + lVar4 * 8,stride,buf0,0x10);
    round_shift_16bit(buf0,0x10,(int)*piVar1);
    fdct8x16_new_sse2(buf0,buf0,'\r');
    round_shift_16bit(buf0,0x10,(int)piVar1[1]);
    out = palVar2;
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 0x80) {
      transpose_16bit_8x8((__m128i *)((long)buf0[0] + lVar3),out);
      out = out + 0x40;
    }
    palVar2 = palVar2 + 8;
  }
  out_00 = output;
  for (lVar4 = 0; lVar4 != 0x800; lVar4 = lVar4 + 0x400) {
    palVar2 = (__m128i *)((long)buf1[0] + lVar4);
    av1_fdct8x64_new_sse2(palVar2,palVar2,'\f');
    round_shift_16bit(palVar2,0x40,(int)piVar1[2]);
    store_buffer_16bit_to_32bit_w8(palVar2,out_00,0x10,0x20);
    out_00 = out_00 + 8;
  }
  memset(output + 0x200,0,0x800);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_64x16_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X16;
  __m128i buf0[64], buf1[128];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = fdct8x16_new_sse2;
  const transform_1d_sse2 row_txfm = av1_fdct8x64_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < height_div8; ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }

  for (int i = 0; i < height_div8; i++) {
    __m128i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, 16, 32);
  }
  // Zero out the bottom 16x32 area.
  memset(output + 16 * 32, 0, 16 * 32 * sizeof(*output));
}